

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O3

bool __thiscall ON_NurbsCurve::IsValid(ON_NurbsCurve *this,ON_TextLog *text_log)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  char *pcVar11;
  double *pdVar12;
  double *pdVar13;
  ulong uVar14;
  int iVar15;
  double dVar16;
  ON_3dPoint P1;
  ON_3dPoint P0;
  ulong local_70;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  uVar2 = this->m_dim;
  if ((int)uVar2 < 1) {
    if (text_log == (ON_TextLog *)0x0) goto LAB_00539684;
    pcVar11 = "ON_NurbsCurve.m_dim = %d (should be > 0).\n";
    uVar8 = (ulong)uVar2;
  }
  else {
    uVar7 = this->m_order;
    if (1 < (int)uVar7) {
      uVar10 = this->m_cv_count;
      if ((int)uVar10 < (int)uVar7) {
        if (text_log != (ON_TextLog *)0x0) {
          pcVar11 = "ON_NurbsCurve.m_cv_count = %d (should be >= m_order=%d).\n";
LAB_005396b0:
          ON_TextLog::Print(text_log,pcVar11,(ulong)uVar10,(ulong)uVar7);
        }
        goto LAB_00539684;
      }
      if ((text_log != (ON_TextLog *)0x0) &&
         (this->m_cv_stride < (int)((uVar2 + 1) - (uint)(this->m_is_rat == 0)))) {
        ON_TextLog::Print(text_log,"ON_NurbsCurve.m_cv_stride = %d (should be >= %d).\n");
      }
      if (this->m_cv == (double *)0x0) {
        if (text_log == (ON_TextLog *)0x0) goto LAB_00539684;
        pcVar11 = "ON_NurbsCurve.m_cv is nullptr.\n";
      }
      else if (this->m_knot == (double *)0x0) {
        if (text_log == (ON_TextLog *)0x0) goto LAB_00539684;
        pcVar11 = "ON_NurbsCurve.m_knot is nullptr.\n";
      }
      else {
        bVar4 = ON_IsValidKnotVector(this->m_order,this->m_cv_count,this->m_knot,text_log);
        if (bVar4) {
          uVar8 = 0;
          if (0 < this->m_dim) {
            uVar8 = (ulong)((this->m_dim + 1) - (uint)(this->m_is_rat == 0));
          }
          pdVar12 = this->m_cv;
          if (pdVar12 == (double *)0x0) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"cv pointer is null.\n");
            }
          }
          else {
            uVar2 = this->m_cv_count;
            if ((int)uVar2 < 2) {
              if (text_log != (ON_TextLog *)0x0) {
                pcVar11 = "cv_count = %d (must be >= 2).\n";
                uVar8 = (ulong)uVar2;
LAB_005397d4:
                ON_TextLog::Print(text_log,pcVar11,uVar8);
              }
            }
            else if ((int)uVar8 < 1) {
              if (text_log != (ON_TextLog *)0x0) {
                pcVar11 = "cv_size = %d (must be >= 1).\n";
                uVar8 = 0;
                goto LAB_005397d4;
              }
            }
            else {
              uVar7 = this->m_cv_stride;
              if ((int)uVar8 <= (int)uVar7) {
                local_70 = 0;
                do {
                  uVar14 = 0;
                  do {
                    bVar4 = ON_IsValid(pdVar12[uVar14]);
                    if (!bVar4) {
                      if (text_log != (ON_TextLog *)0x0) {
                        ON_TextLog::Print(text_log,"cv[%d*cv_stride + %d] = %g is not valid.\n",
                                          pdVar12[uVar14],local_70);
                      }
                      goto LAB_005397db;
                    }
                    uVar14 = uVar14 + 1;
                  } while (uVar8 != uVar14);
                  uVar10 = (int)local_70 + 1;
                  local_70 = (ulong)uVar10;
                  pdVar12 = pdVar12 + uVar7;
                } while (uVar10 != uVar2);
                goto LAB_005397e8;
              }
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,
                                  "cv_stride = %d and cv_size = %d (cv_stride must be >= cv_size).\n"
                                 );
              }
            }
          }
LAB_005397db:
          bVar4 = ON_IsNotValid();
          if (bVar4) {
LAB_005397e8:
            bVar4 = true;
            if (this->m_is_rat != 0) {
              uVar2 = this->m_cv_count;
              if (0 < (int)uVar2) {
                iVar3 = this->m_order;
                pdVar13 = this->m_cv + this->m_dim;
                pdVar12 = this->m_knot;
                lVar9 = 0;
                iVar15 = 0;
                dVar16 = 0.0;
                do {
                  dVar1 = *pdVar13;
                  iVar15 = iVar15 + 1;
                  if (dVar1 != 0.0) {
                    iVar15 = 0;
                  }
                  if (NAN(dVar1)) {
                    iVar15 = 0;
                  }
                  iVar6 = (int)lVar9;
                  if (iVar3 <= iVar15) {
                    if (text_log == (ON_TextLog *)0x0) goto LAB_00539684;
                    uVar7 = -iVar6;
                    uVar10 = 1 - (iVar3 + iVar6);
                    pcVar11 = "ON_NurbsCurve.m_cv has zero weights for CV[%d],...,CV[%d].\n";
                    goto LAB_005396b0;
                  }
                  if ((*pdVar12 == pdVar12[(long)iVar3 + -2]) &&
                     (!NAN(*pdVar12) && !NAN(pdVar12[(long)iVar3 + -2]))) {
                    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
                      if (text_log == (ON_TextLog *)0x0) goto LAB_00539684;
                      pcVar11 = "ON_NurbsCurve.m_cv has zero weights for CV[%d].\n";
                      uVar8 = (ulong)(uint)-iVar6;
                      goto LAB_0053967d;
                    }
                    if ((dVar16 != 0.0) || (NAN(dVar16))) {
                      if (dVar1 * dVar16 <= 0.0) {
                        if (text_log != (ON_TextLog *)0x0) {
                          ON_TextLog::Print(text_log,
                                            "ON_NurbsCurve.m_cv has a zero denominator in the parameter interval [%g,%g].\n"
                                            ,pdVar12[-1]);
                        }
                        goto LAB_00539684;
                      }
                    }
                    else {
                      dVar16 = *(double *)(&DAT_006994d0 + (ulong)(0.0 < dVar1) * 8);
                    }
                  }
                  pdVar12 = pdVar12 + 1;
                  lVar9 = lVar9 + -1;
                  pdVar13 = pdVar13 + this->m_cv_stride;
                } while ((ulong)uVar2 + lVar9 != 0);
                if (((uVar2 == 2) && (this->m_dim < 4)) && (iVar3 == 2)) {
                  ON_Curve::PointAtStart(&local_48,&this->super_ON_Curve);
                  ON_Curve::PointAtEnd(&local_60,&this->super_ON_Curve);
                  bVar5 = ON_3dPoint::operator==(&local_48,&local_60);
                  if (bVar5) {
                    if (text_log != (ON_TextLog *)0x0) {
                      ON_TextLog::Print(text_log,"ON_NurbsCurve is a line with no length.\n");
                    }
                    bVar4 = ON_IsNotValid();
                  }
                }
              }
            }
            return bVar4;
          }
          if (text_log == (ON_TextLog *)0x0) goto LAB_00539684;
          pcVar11 = "ON_NurbsCurve.m_cv[] is not valid.\n";
        }
        else {
          if (text_log == (ON_TextLog *)0x0) goto LAB_00539684;
          pcVar11 = "ON_NurbsCurve.m_knot[] is not a valid knot vector.\n";
        }
      }
      ON_TextLog::Print(text_log,pcVar11);
      goto LAB_00539684;
    }
    if (text_log == (ON_TextLog *)0x0) goto LAB_00539684;
    pcVar11 = "ON_NurbsCurve.m_order = %d (should be >= 2).\n";
    uVar8 = (ulong)uVar7;
  }
LAB_0053967d:
  ON_TextLog::Print(text_log,pcVar11,uVar8);
LAB_00539684:
  bVar4 = ON_IsNotValid();
  return bVar4;
}

Assistant:

bool ON_NurbsCurve::IsValid( ON_TextLog* text_log ) const
{
  if ( m_dim <= 0 )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_dim = %d (should be > 0).\n",m_dim);
    }
    return ON_NurbsCurveIsNotValid();
  }
  
  if (m_order < 2 )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_order = %d (should be >= 2).\n",m_order);
    }
    return ON_NurbsCurveIsNotValid();
  }
  
  if (m_cv_count < m_order )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_cv_count = %d (should be >= m_order=%d).\n",m_cv_count,m_order);
    }
    return ON_NurbsCurveIsNotValid();
  }
  
  if (m_cv_stride < CVSize() )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_cv_stride = %d (should be >= %d).\n",m_cv_stride,CVSize());
    }
  }
  
  if (m_cv == nullptr)
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_cv is nullptr.\n");
    }
    return ON_NurbsCurveIsNotValid();
  }
  
  if (m_knot == nullptr)
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_knot is nullptr.\n");
    }
    return ON_NurbsCurveIsNotValid();
  }

  if ( !ON_IsValidKnotVector( m_order, m_cv_count, m_knot, text_log ) ) 
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_knot[] is not a valid knot vector.\n");
    }
    return ON_NurbsCurveIsNotValid();
  }

  if ( !ON_ControlPointsAreValid(CVSize(),m_cv_count,m_cv_stride,m_cv,text_log) )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsCurve.m_cv[] is not valid.\n");
    }
    return ON_NurbsCurveIsNotValid();
  }

  if ( m_is_rat )
  {
    // weights at fully multiple knots must be nonzero
    // partial test for weight function being zero
    double sign = 0.0;
    const double* w = &m_cv[m_dim];
    int zcount = 0;
    int i;
    for ( i = 0; i < m_cv_count; i++, w += m_cv_stride )
    {
      if ( *w == 0.0 )
        zcount++;
      else
        zcount = 0;

      if ( zcount >= m_order )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsCurve.m_cv has zero weights for CV[%d],...,CV[%d].\n",i-m_order+1,i);
        }
        return ON_NurbsCurveIsNotValid(); // denominator is zero for entire span
      }
      
      if ( m_knot[i] == m_knot[i+m_order-2] ) 
      {
        if ( *w == 0.0 )
        {
          if ( text_log )
          {
            text_log->Print("ON_NurbsCurve.m_cv has zero weights for CV[%d].\n",i);
          }
          return ON_NurbsCurveIsNotValid();
        }
        
        if (sign == 0.0) 
        {
          sign = (*w > 0.0) ? 1.0 : -1.0;
        }
        else if ( *w * sign <= 0.0 ) 
        {
          if ( text_log )
          {
            text_log->Print("ON_NurbsCurve.m_cv has a zero denominator in the parameter interval [%g,%g].\n",
                            m_knot[i-1],m_knot[i]);
          }
          return ON_NurbsCurveIsNotValid();
        }
      }
    }

    if ( m_dim <= 3 && 2 == m_order && 2 == m_cv_count )
    {
      // fix for RR 21239
      // 16 November 2010 Chuck and Dale Lear added m_dim <= 3
      // so the 3d checking does not interfere with applications
      // that use high dimension curves where the start and end
      // points can be arbitrary.
      ON_3dPoint P0 = PointAtStart();
      ON_3dPoint P1 = PointAtEnd();
      if ( P0 == P1 )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsCurve is a line with no length.\n");
        }
        return ON_NurbsCurveIsNotValid();
      }
    }
  }

  return true;
}